

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O0

void __thiscall
tcu::Vector<tcu::Interval,_4>::Vector(Vector<tcu::Interval,_4> *this,Vector<tcu::Interval,_4> *v)

{
  undefined7 uVar1;
  Interval *pIVar2;
  Interval *pIVar3;
  Interval *local_28;
  int local_1c;
  int i;
  Vector<tcu::Interval,_4> *v_local;
  Vector<tcu::Interval,_4> *this_local;
  
  local_28 = this->m_data;
  do {
    Interval::Interval(local_28);
    local_28 = local_28 + 1;
  } while (local_28 != this[1].m_data);
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    pIVar3 = v->m_data + local_1c;
    pIVar2 = this->m_data + local_1c;
    uVar1 = *(undefined7 *)&pIVar3->field_0x1;
    pIVar2->m_hasNaN = pIVar3->m_hasNaN;
    *(undefined7 *)&pIVar2->field_0x1 = uVar1;
    pIVar2->m_lo = pIVar3->m_lo;
    pIVar2->m_hi = pIVar3->m_hi;
  }
  return;
}

Assistant:

inline Vector<T, Size>::Vector (const Vector<T, Size>& v)
{
	for (int i = 0; i < Size; i++)
		m_data[i] = v.m_data[i];
}